

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::PrefixedExpr(SQCompiler *this)

{
  long lVar1;
  SQFuncState *this_00;
  long lVar2;
  bool bVar3;
  SQInteger arg2;
  SQInteger arg3;
  SQInteger SVar4;
  SQInteger SVar5;
  SQOpcode _op;
  SQFuncState *pSVar6;
  SQObject SVar7;
  SQObject local_40;
  
  Factor(this);
  do {
    while (lVar1 = this->_token, lVar1 != 0x28) {
      if (lVar1 == 0x2e) {
        Lex(this);
        pSVar6 = this->_fs;
        SVar5 = SQFuncState::PushTarget(pSVar6,-1);
        this_00 = this->_fs;
        SVar7 = Expect(this,0x102);
        local_40._unVal = SVar7._unVal;
        local_40._type = SVar7._type;
        SVar4 = SQFuncState::GetConstant(this_00,&local_40);
        SQFuncState::AddInstruction(pSVar6,_OP_LOAD,SVar5,SVar4,0,0);
      }
      else {
        if (lVar1 != 0x5b) {
          if ((lVar1 - 0x12fU < 2) && (bVar3 = IsEndOfStatement(this), !bVar3)) {
            lVar1 = this->_token;
            Lex(this);
            lVar2 = (this->_es).etype;
            if (lVar2 - 1U < 5) {
              lVar1 = (ulong)(lVar1 != 0x130) * 2 + -1;
              switch(lVar2) {
              default:
                if ((this->_es).donot_get != true) {
                  Emit2ArgsOP(this,_OP_PINC,lVar1);
                  return;
                }
              case 1:
                Error(this,"can\'t \'++\' or \'--\' an expression");
                break;
              case 4:
                SVar5 = SQFuncState::PopTarget(this->_fs);
                pSVar6 = this->_fs;
                SVar4 = SQFuncState::PushTarget(pSVar6,-1);
                SQFuncState::AddInstruction(pSVar6,_OP_PINCL,SVar4,SVar5,0,lVar1);
                break;
              case 5:
                SVar5 = SQFuncState::PushTarget(this->_fs,-1);
                SVar4 = SQFuncState::PushTarget(this->_fs,-1);
                SQFuncState::AddInstruction(this->_fs,_OP_GETOUTER,SVar4,(this->_es).epos,0,0);
                SQFuncState::AddInstruction(this->_fs,_OP_PINCL,SVar5,SVar4,0,lVar1);
                SQFuncState::AddInstruction(this->_fs,_OP_SETOUTER,SVar4,(this->_es).epos,SVar4,0);
                SQFuncState::PopTarget(this->_fs);
              }
            }
          }
          return;
        }
        if ((this->_lex)._prevtoken == 10) {
          Error(this,"cannot brake deref/or comma needed after [exp]=exp slot declaration");
        }
        Lex(this);
        Expression(this);
        Expect(this,0x5d);
      }
      if ((this->_es).etype == 3) {
        Emit2ArgsOP(this,_OP_GET,0);
        SVar5 = SQFuncState::TopTarget(this->_fs);
        (this->_es).etype = 1;
        (this->_es).epos = SVar5;
      }
      else {
        bVar3 = NeedGet(this);
        if (bVar3) {
          Emit2ArgsOP(this,_OP_GET,0);
        }
        (this->_es).etype = 2;
      }
    }
    pSVar6 = this->_fs;
    lVar1 = (this->_es).etype;
    if (lVar1 == 5) {
      SVar5 = SQFuncState::PushTarget(pSVar6,-1);
      SQFuncState::AddInstruction(pSVar6,_OP_GETOUTER,SVar5,(this->_es).epos,0,0);
      pSVar6 = this->_fs;
      SVar5 = SQFuncState::PushTarget(pSVar6,-1);
LAB_0011e032:
      _op = _OP_MOVE;
      SVar4 = 0;
      arg2 = 0;
      arg3 = 0;
    }
    else {
      if ((lVar1 == 3) || (lVar1 != 2)) {
        SVar5 = SQFuncState::PushTarget(pSVar6,-1);
        goto LAB_0011e032;
      }
      SVar4 = SQFuncState::PopTarget(pSVar6);
      arg2 = SQFuncState::PopTarget(this->_fs);
      SVar5 = SQFuncState::PushTarget(this->_fs,-1);
      arg3 = SQFuncState::PushTarget(this->_fs,-1);
      pSVar6 = this->_fs;
      _op = _OP_PREPCALL;
    }
    SQFuncState::AddInstruction(pSVar6,_op,SVar5,SVar4,arg2,arg3);
    (this->_es).etype = 1;
    Lex(this);
    FunctionCallArgs(this,false);
  } while( true );
}

Assistant:

void PrefixedExpr()
    {
        SQInteger pos = Factor();
        for(;;) {
            switch(_token) {
            case _SC('.'):
                pos = -1;
                Lex();

                _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(Expect(TK_IDENTIFIER)));
                if(_es.etype==BASE) {
                    Emit2ArgsOP(_OP_GET);
                    pos = _fs->TopTarget();
                    _es.etype = EXPR;
                    _es.epos   = pos;
                }
                else {
                    if(NeedGet()) {
                        Emit2ArgsOP(_OP_GET);
                    }
                    _es.etype = OBJECT;
                }
                break;
            case _SC('['):
                if(_lex._prevtoken == _SC('\n')) Error(_SC("cannot brake deref/or comma needed after [exp]=exp slot declaration"));
                Lex(); Expression(); Expect(_SC(']'));
                pos = -1;
                if(_es.etype==BASE) {
                    Emit2ArgsOP(_OP_GET);
                    pos = _fs->TopTarget();
                    _es.etype = EXPR;
                    _es.epos   = pos;
                }
                else {
                    if(NeedGet()) {
                        Emit2ArgsOP(_OP_GET);
                    }
                    _es.etype = OBJECT;
                }
                break;
            case TK_MINUSMINUS:
            case TK_PLUSPLUS:
                {
                    if(IsEndOfStatement()) return;
                    SQInteger diff = (_token==TK_MINUSMINUS) ? -1 : 1;
                    Lex();
                    switch(_es.etype)
                    {
                        case EXPR: Error(_SC("can't '++' or '--' an expression")); break;
                        case OBJECT:
                        case BASE:
                            if(_es.donot_get == true)  { Error(_SC("can't '++' or '--' an expression")); break; } //mmh dor this make sense?
                            Emit2ArgsOP(_OP_PINC, diff);
                            break;
                        case LOCAL: {
                            SQInteger src = _fs->PopTarget();
                            _fs->AddInstruction(_OP_PINCL, _fs->PushTarget(), src, 0, diff);
                                    }
                            break;
                        case OUTER: {
                            SQInteger tmp1 = _fs->PushTarget();
                            SQInteger tmp2 = _fs->PushTarget();
                            _fs->AddInstruction(_OP_GETOUTER, tmp2, _es.epos);
                            _fs->AddInstruction(_OP_PINCL,    tmp1, tmp2, 0, diff);
                            _fs->AddInstruction(_OP_SETOUTER, tmp2, _es.epos, tmp2);
                            _fs->PopTarget();
                        }
                    }
                }
                return;
                break;
            case _SC('('):
                switch(_es.etype) {
                    case OBJECT: {
                        SQInteger key     = _fs->PopTarget();  /* location of the key */
                        SQInteger table   = _fs->PopTarget();  /* location of the object */
                        SQInteger closure = _fs->PushTarget(); /* location for the closure */
                        SQInteger ttarget = _fs->PushTarget(); /* location for 'this' pointer */
                        _fs->AddInstruction(_OP_PREPCALL, closure, key, table, ttarget);
                        }
                        break;
                    case BASE:
                        //Emit2ArgsOP(_OP_GET);
                        _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), 0);
                        break;
                    case OUTER:
                        _fs->AddInstruction(_OP_GETOUTER, _fs->PushTarget(), _es.epos);
                        _fs->AddInstruction(_OP_MOVE,     _fs->PushTarget(), 0);
                        break;
                    default:
                        _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), 0);
                }
                _es.etype = EXPR;
                Lex();
                FunctionCallArgs();
                break;
            default: return;
            }
        }
    }